

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wireframe.cpp
# Opt level: O2

void line(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  uint uVar1;
  int iVar2;
  size_t y;
  int iVar3;
  size_t x;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  TGAColor local_58 [2];
  int local_4c;
  uint local_48;
  uint local_44;
  TGAImage *local_40;
  ulong local_38;
  
  local_58[0].bgra = color.bgra;
  uVar1 = x0 - x1;
  local_44 = -uVar1;
  if (0 < (int)uVar1) {
    local_44 = uVar1;
  }
  local_58[0].bytespp = color.bytespp;
  uVar1 = y0 - y1;
  local_48 = -uVar1;
  if (0 < (int)uVar1) {
    local_48 = uVar1;
  }
  iVar3 = x1;
  iVar7 = y0;
  if (local_44 < local_48) {
    iVar3 = y1;
    iVar7 = x0;
    y1 = x1;
    x0 = y0;
  }
  iVar4 = y1;
  iVar2 = iVar3;
  iVar6 = x0;
  if (iVar3 < x0) {
    iVar4 = iVar7;
    iVar2 = x0;
    iVar6 = iVar3;
    iVar7 = y1;
  }
  local_38 = (ulong)(uint)(iVar2 - iVar6);
  iVar5 = iVar4 - iVar7;
  iVar9 = -iVar5;
  if (0 < iVar5) {
    iVar9 = iVar5;
  }
  local_4c = (uint)(iVar5 != 0 && iVar7 <= iVar4) * 2 + -1;
  if (iVar3 < x0) {
    x0 = iVar3;
  }
  iVar3 = 0;
  local_40 = image;
  for (sVar8 = (size_t)x0; (long)sVar8 <= (long)iVar2; sVar8 = sVar8 + 1) {
    y = (long)iVar7;
    x = sVar8;
    if (local_44 < local_48) {
      y = sVar8;
      x = (long)iVar7;
    }
    TGAImage::set(local_40,x,y,local_58);
    iVar3 = iVar3 + iVar9 * 2;
    iVar4 = 0;
    if ((int)local_38 < iVar3) {
      iVar4 = (iVar2 - iVar6) * 2;
    }
    iVar5 = 0;
    if ((int)local_38 < iVar3) {
      iVar5 = local_4c;
    }
    iVar3 = iVar3 - iVar4;
    iVar7 = iVar7 + iVar5;
  }
  return;
}

Assistant:

void line(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    int dx = x1 - x0;
    int dy = y1 - y0;
    int derror2 = std::abs(dy) * 2;
    int error2 = 0;
    int y = y0;
    for (int x = x0; x <= x1; x++) {
        if (steep) {
            image.set(y, x, color);
        } else {
            image.set(x, y, color);
        }
        error2 += derror2;
        if (error2 > dx) {
            y += (y1 > y0 ? 1 : -1);
            error2 -= dx * 2;
        }
    }
}